

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

ByteData *
cfd::core::WallyUtil::MulTweakPrivkey
          (ByteData *__return_storage_ptr__,ByteData *privkey,ByteData256 *tweak)

{
  secp256k1_context_struct *context;
  Secp256k1 secp256k1;
  Secp256k1 SStack_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  context = wally_get_secp_context();
  Secp256k1::Secp256k1(&SStack_58,context);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,tweak);
  ByteData::ByteData((ByteData *)&local_50,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  Secp256k1::MulTweakPrivkeySecp256k1Ec
            (__return_storage_ptr__,&SStack_58,privkey,(ByteData *)&local_50);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData WallyUtil::MulTweakPrivkey(
    const ByteData& privkey, const ByteData256& tweak) {
  struct secp256k1_context_struct* context = wally_get_secp_context();
  Secp256k1 secp256k1(context);
  return secp256k1.MulTweakPrivkeySecp256k1Ec(
      privkey, ByteData(tweak.GetBytes()));
}